

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder_.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  double covfac;
  int one;
  double wa4 [15];
  double wa3 [3];
  double wa2 [3];
  double wa1 [3];
  double qtf [3];
  double diag [3];
  double fjac [45];
  double fvec [15];
  double x [3];
  double fnorm;
  double factor;
  double gtol;
  double xtol;
  double ftol;
  int ipvt [3];
  int njev;
  int nfev;
  int info;
  int nprint;
  int mode;
  int maxfev;
  int ldfjac;
  int n;
  int m;
  int j;
  int i;
  double *x_00;
  int *n_00;
  int local_3cc [15];
  double *in_stack_fffffffffffffc70;
  double *in_stack_fffffffffffffc78;
  double *in_stack_fffffffffffffc80;
  int *in_stack_fffffffffffffc88;
  int *in_stack_fffffffffffffc90;
  minpack_funcder_mn in_stack_fffffffffffffc98;
  int *in_stack_fffffffffffffcc0;
  double *in_stack_fffffffffffffcc8;
  double *in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffcd8;
  int *in_stack_fffffffffffffce0;
  double *in_stack_fffffffffffffce8;
  int *in_stack_fffffffffffffcf0;
  double *in_stack_fffffffffffffcf8;
  int *in_stack_fffffffffffffd00;
  int *in_stack_fffffffffffffd08;
  int *in_stack_fffffffffffffd10;
  int *in_stack_fffffffffffffd18;
  int *in_stack_fffffffffffffd20;
  double *in_stack_fffffffffffffd28;
  double *in_stack_fffffffffffffd30;
  double *in_stack_fffffffffffffd38;
  double *in_stack_fffffffffffffd40;
  double *in_stack_fffffffffffffd48;
  double local_2a8 [62];
  undefined8 local_b8 [4];
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  double local_80;
  double local_78;
  int local_6c [3];
  uint local_60;
  uint local_5c;
  uint local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  
  local_34 = 0;
  local_3cc[0] = 1;
  local_40 = 0xf;
  local_44 = 3;
  local_b8[0] = 0x3ff0000000000000;
  local_b8[1] = 0x3ff0000000000000;
  local_b8[2] = 0x3ff0000000000000;
  local_48 = 0xf;
  dVar3 = dpmpar_(local_3cc);
  local_78 = sqrt(dVar3);
  dVar3 = dpmpar_(local_3cc);
  local_80 = sqrt(dVar3);
  local_88 = 0;
  local_4c = 400;
  local_50 = 1;
  local_90 = 0x4059000000000000;
  local_54 = 0;
  x_00 = (double *)&stack0xfffffffffffffcf8;
  n_00 = (int *)&stack0xfffffffffffffcd8;
  lmder_(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
         in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
         in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0,
         in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,
         in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,
         in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
         in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,
         in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
  local_98 = enorm_(n_00,x_00);
  printf("      final l2 norm of the residuals%15.7g\n\n",local_98);
  printf("      number of function evaluations%10i\n\n",(ulong)local_5c);
  printf("      number of Jacobian evaluations%10i\n\n",(ulong)local_60);
  printf("      exit parameter                %10i\n\n",(ulong)local_58);
  printf("      final approximate solution\n");
  for (local_3c = 1; local_3c <= local_44; local_3c = local_3c + 1) {
    pcVar2 = "";
    if (local_3c % 3 == 1) {
      pcVar2 = "\n     ";
    }
    printf("%s%15.7g",local_b8[local_3c + -1],pcVar2);
  }
  printf("\n");
  local_78 = dpmpar_(local_3cc);
  dVar3 = local_98 * local_98;
  iVar1 = local_40 - local_44;
  covar_(&local_44,local_2a8,&local_48,local_6c,&local_78,(double *)&stack0xfffffffffffffcf8);
  printf("      covariance\n");
  for (local_38 = 1; local_38 <= local_44; local_38 = local_38 + 1) {
    for (local_3c = 1; local_3c <= local_44; local_3c = local_3c + 1) {
      pcVar2 = "";
      if (local_3c % 3 == 1) {
        pcVar2 = "\n     ";
      }
      printf("%s%15.7g",
             local_2a8[(local_38 + -1) * local_48 + local_3c + -1] * (dVar3 / (double)iVar1),pcVar2)
      ;
    }
  }
  printf("\n");
  return 0;
}

Assistant:

int main()
{
  int i, j, m, n, ldfjac, maxfev, mode, nprint, info, nfev, njev;
  int ipvt[3];
  real ftol, xtol, gtol, factor, fnorm;
  real x[3], fvec[15], fjac[15*3], diag[3], qtf[3], 
    wa1[3], wa2[3], wa3[3], wa4[15];
  int one=1;
  real covfac;

  m = 15;
  n = 3;

/*      the following starting values provide a rough fit. */

  x[1-1] = 1.;
  x[2-1] = 1.;
  x[3-1] = 1.;

  ldfjac = 15;

  /*      set ftol and xtol to the square root of the machine */
  /*      and gtol to zero. unless high solutions are */
  /*      required, these are the recommended settings. */

  ftol = sqrt(__minpack_func__(dpmpar)(&one));
  xtol = sqrt(__minpack_func__(dpmpar)(&one));
  gtol = 0.;
    
  maxfev = 400;
  mode = 1;
  factor = 1.e2;
  nprint = 0;

  __minpack_func__(lmder)(&fcn, &m, &n, x, fvec, fjac, &ldfjac, &ftol, &xtol, &gtol, 
	&maxfev, diag, &mode, &factor, &nprint, &info, &nfev, &njev, 
	ipvt, qtf, wa1, wa2, wa3, wa4);
  fnorm = __minpack_func__(enorm)(&m, fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      number of function evaluations%10i\n\n", nfev);
  printf("      number of Jacobian evaluations%10i\n\n", njev);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=1; j<=n; j++) {
    printf("%s%15.7g", j%3==1?"\n     ":"", (double)x[j-1]);
  }
  printf("\n");
  ftol = __minpack_func__(dpmpar)(&one);
  covfac = fnorm*fnorm/(m-n);
  __minpack_func__(covar)(&n, fjac, &ldfjac, ipvt, &ftol, wa1);
  printf("      covariance\n");
  for (i=1; i<=n; i++) {
    for (j=1; j<=n; j++) {
      printf("%s%15.7g", j%3==1?"\n     ":"", (double)(fjac[(i-1)*ldfjac+j-1]*covfac));
    }
  }
  printf("\n");
  return 0;
}